

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_close(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  int ret;
  mtree_writer *mtree;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if ((*(long *)((long)pvVar1 + 8) == 0) || (iVar2 = write_mtree_entry_tree(a), iVar2 == 0)) {
    archive_write_set_bytes_in_last_block(&a->archive,1);
    a_local._4_4_ =
         __archive_write_output(a,*(void **)((long)pvVar1 + 0x58),*(size_t *)((long)pvVar1 + 0x60));
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}